

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
pbrt::Instance::Instance(Instance *this,shared_ptr<pbrt::Object> *object,affine3f *xfm)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  undefined8 *in_RDX;
  Entity *in_RDI;
  
  Entity::Entity(in_RDI);
  in_RDI->_vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__0029c378;
  std::shared_ptr<pbrt::Object>::shared_ptr
            ((shared_ptr<pbrt::Object> *)in_RDI,(shared_ptr<pbrt::Object> *)(in_RDI + 1));
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RDX;
  pp_Var2 = (_func_int **)in_RDX[1];
  peVar3 = (element_type *)in_RDX[2];
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[3];
  peVar5 = (element_type *)in_RDX[5];
  in_RDI[3]._vptr_Entity = (_func_int **)in_RDX[4];
  in_RDI[3].super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  in_RDI[2].super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  in_RDI[2].super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  in_RDI[1].super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  in_RDI[2]._vptr_Entity = pp_Var2;
  std::mutex::mutex((mutex *)0x220a41);
  *(undefined1 *)
   &in_RDI[5].super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  math::box3f::box3f((box3f *)in_RDI);
  return;
}

Assistant:

Instance(const std::shared_ptr<Object> &object,
             const affine3f                &xfm)
      : object(object), xfm(xfm)
    {}